

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_Writer.cpp
# Opt level: O2

void __thiscall OSTEI_Writer::WriteShellOffsets(OSTEI_Writer *this)

{
  int iVar1;
  ostream *poVar2;
  OSTEI_HRR_Algorithm_Base *this_00;
  _Base_ptr p_Var3;
  _Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_> local_b0;
  undefined1 local_80 [48];
  string local_50;
  
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar2,"// calculate the shell offsets\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar2,"// these are the offset from the shell pointed to by cd\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar2,"// for each element\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar2,"int shelloffsets[SIMINT_SIMD_LEN] = {0};\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar2,"int lastoffset = 0;\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar2,
                  "const int nlane = ( ((j + SIMINT_SIMD_LEN) < jend) ? SIMINT_SIMD_LEN : (jend - j));\n"
                 );
  std::operator<<((this->super_OSTEI_Writer_Base).os_,"\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar2,"if((iprimcd + SIMINT_SIMD_LEN) >= nprim_icd)\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent6_abi_cxx11_);
  std::operator<<(poVar2,"// Handle if the first element of the vector is a new shell\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent6_abi_cxx11_);
  std::operator<<(poVar2,"if(iprimcd >= nprim_icd && ((icd+1) < nshellbatch))\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent6_abi_cxx11_);
  std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent7_abi_cxx11_);
  std::operator<<(poVar2,"nprim_icd += Q.nprim12[cd + (++icd)];\n");
  this_00 = OSTEI_HRR_Writer::Algo((this->super_OSTEI_Writer_Base).hrr_writer_);
  OSTEI_HRR_Algorithm_Base::TopAM((QAMSet *)&local_b0,this_00);
  for (p_Var3 = local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &local_b0._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent7_abi_cxx11_);
    PrimPtrName_abi_cxx11_(&local_50,(QAM *)(p_Var3 + 1));
    poVar2 = std::operator<<(poVar2,(string *)&local_50);
    poVar2 = std::operator<<(poVar2," += ");
    QAM::QAM((QAM *)local_80,(QAM *)(p_Var3 + 1));
    iVar1 = NCART((QAM *)local_80);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
    std::operator<<(poVar2,";\n");
    std::__cxx11::string::~string((string *)(local_80 + 0x10));
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::~_Rb_tree
            (&local_b0);
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent6_abi_cxx11_);
  std::operator<<(poVar2,"}\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent6_abi_cxx11_);
  std::operator<<(poVar2,"iprimcd++;\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent6_abi_cxx11_);
  std::operator<<(poVar2,"for(n = 1; n < SIMINT_SIMD_LEN; ++n)\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent6_abi_cxx11_);
  std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent7_abi_cxx11_);
  std::operator<<(poVar2,"if(iprimcd >= nprim_icd && ((icd+1) < nshellbatch))\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent7_abi_cxx11_);
  std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent8_abi_cxx11_);
  std::operator<<(poVar2,"shelloffsets[n] = shelloffsets[n-1] + 1;\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent8_abi_cxx11_);
  std::operator<<(poVar2,"lastoffset++;\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent8_abi_cxx11_);
  std::operator<<(poVar2,"nprim_icd += Q.nprim12[cd + (++icd)];\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent7_abi_cxx11_);
  std::operator<<(poVar2,"}\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent7_abi_cxx11_);
  std::operator<<(poVar2,"else\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent8_abi_cxx11_);
  std::operator<<(poVar2,"shelloffsets[n] = shelloffsets[n-1];\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent7_abi_cxx11_);
  std::operator<<(poVar2,"iprimcd++;\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent6_abi_cxx11_);
  std::operator<<(poVar2,"}\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar2,"}\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar2,"else\n");
  poVar2 = std::operator<<((this->super_OSTEI_Writer_Base).os_,(string *)&indent6_abi_cxx11_);
  std::operator<<(poVar2,"iprimcd += SIMINT_SIMD_LEN;\n\n");
  return;
}

Assistant:

void OSTEI_Writer::WriteShellOffsets(void) const
{
    os_ << indent5 << "// calculate the shell offsets\n";
    os_ << indent5 << "// these are the offset from the shell pointed to by cd\n";
    os_ << indent5 << "// for each element\n";
    os_ << indent5 << "int shelloffsets[SIMINT_SIMD_LEN] = {0};\n";
    os_ << indent5 << "int lastoffset = 0;\n";
    os_ << indent5 << "const int nlane = ( ((j + SIMINT_SIMD_LEN) < jend) ? SIMINT_SIMD_LEN : (jend - j));\n";
    os_ << "\n";
    os_ << indent5 << "if((iprimcd + SIMINT_SIMD_LEN) >= nprim_icd)\n";
    os_ << indent5 << "{\n";

    os_ << indent6 << "// Handle if the first element of the vector is a new shell\n";
    os_ << indent6 << "if(iprimcd >= nprim_icd && ((icd+1) < nshellbatch))\n";
    os_ << indent6 << "{\n";
    os_ << indent7 << "nprim_icd += Q.nprim12[cd + (++icd)];\n";

    for(const auto &it : hrr_writer_.Algo().TopAM())
        os_ << indent7 << PrimPtrName(it) << " += " << NCART(it) << ";\n";

    os_ << indent6 << "}\n";
    os_ << indent6 << "iprimcd++;\n";

    os_ << indent6 << "for(n = 1; n < SIMINT_SIMD_LEN; ++n)\n";
    os_ << indent6 << "{\n";
    os_ << indent7 << "if(iprimcd >= nprim_icd && ((icd+1) < nshellbatch))\n";
    os_ << indent7 << "{\n";
    os_ << indent8 << "shelloffsets[n] = shelloffsets[n-1] + 1;\n";
    os_ << indent8 << "lastoffset++;\n";
    os_ << indent8 << "nprim_icd += Q.nprim12[cd + (++icd)];\n";
    os_ << indent7 << "}\n";
    os_ << indent7 << "else\n";
    os_ << indent8 << "shelloffsets[n] = shelloffsets[n-1];\n";
    os_ << indent7 << "iprimcd++;\n";
    os_ << indent6 << "}\n";
    os_ << indent5 << "}\n";
    os_ << indent5 << "else\n";
    os_ << indent6 << "iprimcd += SIMINT_SIMD_LEN;\n\n";
}